

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O1

Statistic * __thiscall Statistic::operator=(Statistic *this,Statistic *stat)

{
  size_t sVar1;
  char *__dest;
  
  if (this != stat) {
    if (this->psKey != (char *)0x0) {
      operator_delete__(this->psKey);
    }
    sVar1 = strlen(stat->psKey);
    __dest = (char *)operator_new__(sVar1 + 1);
    this->psKey = __dest;
    strcpy(__dest,stat->psKey);
    this->iValue = stat->iValue;
  }
  return this;
}

Assistant:

Statistic& Statistic::operator=(const Statistic &stat)
{
   if (this==&stat)
      return *this;

   delete [] psKey;
   psKey = new char[strlen(stat.psKey)+1];
   strcpy (psKey, stat.psKey);

   iValue = stat.iValue;

   return *this;
}